

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O2

void __thiscall EPoller::~EPoller(EPoller *this)

{
  close(this->epollfd_);
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->channels_)._M_h);
  std::_Vector_base<epoll_event,_std::allocator<epoll_event>_>::~_Vector_base
            (&(this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>);
  return;
}

Assistant:

EPoller::~EPoller() {
    close(epollfd_);
}